

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O1

void absl::cord_internal::CordRepFlat::Delete(CordRep *rep)

{
  byte bVar1;
  sbyte sVar2;
  int iVar3;
  sbyte sVar4;
  int iVar5;
  
  bVar1 = rep->tag;
  if ((6 < bVar1 - 0xf9) && (5 < bVar1)) {
    iVar3 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar3 = -0xe80;
    }
    sVar4 = 0xc;
    if (bVar1 < 0xbb) {
      sVar4 = 6;
    }
    iVar5 = -0x10;
    if (0x42 < bVar1) {
      iVar5 = iVar3;
    }
    sVar2 = 3;
    if (0x42 < bVar1) {
      sVar2 = sVar4;
    }
    operator_delete(rep,(long)(int)(((uint)bVar1 << sVar2) + iVar5));
    return;
  }
  __assert_fail("rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                ,0x92,"static void absl::cord_internal::CordRepFlat::Delete(CordRep *)");
}

Assistant:

static void Delete(CordRep*rep) {
    assert(rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG);

#if defined(__cpp_sized_deallocation)
    size_t size = TagToAllocatedSize(rep->tag);
    rep->~CordRep();
    ::operator delete(rep, size);
#else
    rep->~CordRep();
    ::operator delete(rep);
#endif
  }